

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  double *pdVar1;
  double *pdVar2;
  DstXprType *pDVar3;
  PointerType pdVar4;
  ulong uVar5;
  DstEvaluatorType *pDVar6;
  SrcEvaluatorType *pSVar7;
  double dVar8;
  long lVar9;
  Index inner_1;
  long lVar10;
  ulong uVar11;
  Index inner;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Index col;
  long lVar15;
  Index row;
  ulong uVar16;
  
  pDVar3 = kernel->m_dstExpr;
  pdVar4 = (pDVar3->
           super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.
           m_data;
  if (((ulong)pdVar4 & 7) == 0) {
    uVar5 = (pDVar3->
            super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.
            m_rows.m_value;
    lVar9 = (pDVar3->
            super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.
            m_cols.m_value;
    uVar11 = (ulong)((uint)((ulong)pdVar4 >> 3) & 1);
    if ((long)uVar5 <= (long)uVar11) {
      uVar11 = uVar5;
    }
    lVar14 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar14;
    }
    for (lVar15 = 0; lVar15 != lVar9; lVar15 = lVar15 + 1) {
      pDVar6 = kernel->m_dst;
      pSVar7 = kernel->m_src;
      uVar12 = 0;
      if (0 < (long)uVar11) {
        uVar12 = uVar11;
      }
      for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        *(double *)
         ((long)(pDVar6->
                super_block_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>).
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                .m_data + uVar16 * 8 + lVar14) =
             (pSVar7->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>).m_d.
             data[uVar16];
      }
      lVar10 = (uVar5 - uVar11 & 0xfffffffffffffffe) + uVar11;
      for (uVar12 = uVar11; pDVar6 = kernel->m_dst, (long)uVar12 < lVar10; uVar12 = uVar12 + 2) {
        pdVar1 = (kernel->m_src->
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>).
                 m_d.data + uVar12;
        dVar8 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)(pDVar6->
                        super_block_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>
                        ).
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                        .m_data + uVar12 * 8 + lVar14);
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar8;
      }
      pSVar7 = kernel->m_src;
      for (; lVar10 < (long)uVar5; lVar10 = lVar10 + 1) {
        *(double *)
         ((long)(pDVar6->
                super_block_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>).
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                .m_data + lVar10 * 8 + lVar14) =
             (pSVar7->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>).m_d.
             data[lVar10];
      }
      uVar11 = (long)(uVar11 + 1) % 2;
      if ((long)uVar5 < (long)uVar11) {
        uVar11 = uVar5;
      }
      lVar14 = lVar14 + 0x18;
    }
    return;
  }
  pDVar3 = kernel->m_dstExpr;
  lVar9 = (pDVar3->
          super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.m_cols
          .m_value;
  if (lVar9 < 1) {
    lVar9 = 0;
  }
  lVar14 = 0;
  for (lVar15 = 0; lVar15 != lVar9; lVar15 = lVar15 + 1) {
    lVar10 = (pDVar3->
             super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.
             m_rows.m_value;
    pDVar6 = kernel->m_dst;
    pSVar7 = kernel->m_src;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
      *(double *)
       ((long)(pDVar6->
              super_block_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>).
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
              .m_data + lVar13 * 8 + lVar14) =
           (pSVar7->super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
           .m_d.data[lVar13];
    }
    lVar14 = lVar14 + 0x18;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC const Scalar* dstDataPtr() const
  {
    return m_dstExpr.data();
  }